

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatPrinter_p.cpp
# Opt level: O0

string * __thiscall
BamTools::Internal::SamFormatPrinter::ToString_abi_cxx11_(SamFormatPrinter *this)

{
  _Ios_Openmode _Var1;
  string *in_RDI;
  stringstream out;
  stringstream *in_stack_000000b8;
  SamFormatPrinter *in_stack_000000c0;
  allocator *out_00;
  SamFormatPrinter *in_stack_fffffffffffffe30;
  allocator local_1b9;
  string local_1b8 [32];
  stringstream local_198 [144];
  stringstream *in_stack_fffffffffffffef8;
  SamFormatPrinter *in_stack_ffffffffffffff00;
  stringstream *in_stack_ffffffffffffff68;
  SamFormatPrinter *in_stack_ffffffffffffff70;
  stringstream *in_stack_ffffffffffffff98;
  SamFormatPrinter *in_stack_ffffffffffffffa0;
  
  out_00 = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"",out_00);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,local_1b8,_Var1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  PrintHD(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  PrintSQ(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  PrintRG(in_stack_000000c0,in_stack_000000b8);
  PrintPG(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  PrintCO(in_stack_fffffffffffffe30,(stringstream *)out_00);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

const string SamFormatPrinter::ToString(void) const {

    // clear out stream
    stringstream out("");

    // generate formatted header text
    PrintHD(out);
    PrintSQ(out);
    PrintRG(out);
    PrintPG(out);
    PrintCO(out);

    // return result
    return out.str();
}